

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mongoose.c
# Opt level: O3

int mg_rpc_create_request(char *buf,int len,char *method,char *id,char *params_fmt,...)

{
  char in_AL;
  int iVar1;
  int iVar2;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  undefined1 local_e8 [40];
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  local_c0 = in_R9;
  iVar1 = json_emit(buf,len,"{s:s,s:s,s:s,s:","jsonrpc","2.0","id",id,"method",method,"params");
  ap[0].gp_offset = 0x28;
  ap[0].fp_offset = 0x30;
  ap[0].overflow_arg_area = &stack0x00000008;
  ap[0].reg_save_area = local_e8;
  iVar2 = json_emit_va(buf + iVar1,len - iVar1,params_fmt,ap);
  iVar2 = iVar2 + iVar1;
  iVar1 = json_emit(buf + iVar2,len - iVar2,"}");
  return iVar1 + iVar2;
}

Assistant:

int mg_rpc_create_request(char *buf, int len, const char *method,
                          const char *id, const char *params_fmt, ...) {
    va_list ap;
    int n = 0;

    n += json_emit(buf + n, len - n, "{s:s,s:s,s:s,s:", "jsonrpc", "2.0", "id",
                   id, "method", method, "params");
    va_start(ap, params_fmt);
    n += json_emit_va(buf + n, len - n, params_fmt, ap);
    va_end(ap);

    n += json_emit(buf + n, len - n, "}");

    return n;
}